

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O3

void bm_init_skiptable(QStringView needle,uchar *skiptable,CaseSensitivity cs)

{
  storage_type_conflict *psVar1;
  storage_type_conflict sVar2;
  uint uVar3;
  storage_type_conflict *psVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uchar uVar10;
  int __c;
  ulong uVar11;
  
  uVar11 = needle.m_size;
  uVar9 = 0x100;
  if ((long)uVar11 < 0x100) {
    uVar9 = uVar11;
  }
  if (cs == CaseSensitive) {
    uVar9 = uVar11;
  }
  uVar8 = (uint)uVar9;
  uVar11 = 0xff;
  if ((int)uVar8 < 0xff) {
    uVar11 = uVar9 & 0xffffffff;
  }
  __c = (int)uVar11;
  memset(skiptable,__c,0x100);
  psVar1 = needle.m_data + (uVar9 - (long)__c);
  psVar4 = psVar1;
  if (cs == CaseSensitive) {
    if (uVar8 != 0) {
      uVar10 = (uchar)uVar11;
      lVar5 = 0;
      do {
        uVar10 = uVar10 + 0xff;
        skiptable[(byte)psVar1[lVar5]] = uVar10;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != __c);
    }
  }
  else {
    while (uVar8 != 0) {
      sVar2 = *psVar4;
      uVar6 = (uint)(ushort)sVar2;
      if ((psVar1 < psVar4 && ((ushort)sVar2 & 0xfc00) == 0xdc00) &&
         ((psVar4[-1] & 0xfc00U) == 0xd800)) {
        uVar6 = (uint)(ushort)sVar2 + (uint)(ushort)psVar4[-1] * 0x400 + 0xfca02400;
      }
      uVar8 = 0xff;
      if (uVar6 < 0x11000) {
        uVar8 = 0x1f;
      }
      uVar3 = uVar6 >> 5;
      if (0x10fff < uVar6) {
        uVar3 = (uVar6 - 0x11000 >> 8) + 0x880;
      }
      uVar7 = (uint)(int)(short)*(ushort *)
                                 (QUnicodeTables::uc_properties +
                                 (ulong)*(ushort *)
                                         (QUnicodeTables::uc_property_trie +
                                         (ulong)((uVar8 & uVar6) +
                                                (uint)*(ushort *)
                                                       (QUnicodeTables::uc_property_trie +
                                                       (ulong)uVar3 * 2)) * 2) * 0x14 + 0xe) >> 1;
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)((uVar8 & uVar6) +
                           (uint)*(ushort *)(QUnicodeTables::uc_property_trie + (ulong)uVar3 * 2)) *
                    2) * 0x14 + 0xe) & 1) == 0) {
        uVar6 = uVar6 + (uVar7 & 0xffff);
      }
      else {
        lVar5 = (long)(short)uVar7;
        if (*(short *)(QUnicodeTables::specialCaseMap + lVar5 * 2) == 1) {
          uVar6 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + lVar5 * 2 + 2);
        }
      }
      uVar8 = (int)uVar11 - 1;
      skiptable[uVar6 & 0xff] = (char)uVar11 + 0xff;
      uVar11 = (ulong)uVar8;
      psVar4 = psVar4 + 1;
    }
  }
  return;
}

Assistant:

static void bm_init_skiptable(QStringView needle, uchar *skiptable, Qt::CaseSensitivity cs)
{
    const char16_t *uc = needle.utf16();
    const qsizetype len =
            cs == Qt::CaseSensitive ? needle.size() : qMin(needle.size(), FoldBufferCapacity);
    int l = qMin(int(len), 255);
    memset(skiptable, l, 256 * sizeof(uchar));
    uc += len - l;
    if (cs == Qt::CaseSensitive) {
        while (l--) {
            skiptable[*uc & 0xff] = l;
            ++uc;
        }
    } else {
        const char16_t *start = uc;
        while (l--) {
            skiptable[foldCase(uc, start) & 0xff] = l;
            ++uc;
        }
    }
}